

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::CheckOpHelper(LinearScan *this,Instr *instr)

{
  uint uVar1;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *this_00;
  code *pcVar2;
  bool bVar3;
  IRKind IVar4;
  uint32 uVar5;
  uint uVar6;
  Lifetime *lifetime_00;
  BranchInstr *pBVar7;
  PragmaInstr *instr_00;
  LabelInstr *pLVar8;
  Type *pTVar9;
  undefined4 *puVar10;
  Type_conflict pSVar11;
  bool local_75;
  PragmaInstr *dummyLabel;
  OpHelperSpilledLifetime spilledLifetime;
  bool reload;
  Lifetime *lifetime;
  LabelInstr *pLStack_38;
  uint32 helperSpilledLiverangeCount;
  Instr *targetInstr;
  Instr *instr_local;
  LinearScan *this_local;
  
  bVar3 = IsInHelperBlock(this);
  if ((bVar3) && (this->currentOpHelperBlock->opHelperEndInstr == instr)) {
    pLStack_38 = (LabelInstr *)0x0;
    bVar3 = IR::Instr::IsBranchInstr(instr);
    if (bVar3) {
      pBVar7 = IR::Instr::AsBranchInstr(instr);
      bVar3 = IR::BranchInstr::IsUnconditional(pBVar7);
      if (bVar3) {
        pBVar7 = IR::Instr::AsBranchInstr(instr);
        bVar3 = IR::BranchInstr::IsMultiBranch(pBVar7);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x23f,"(!instr->AsBranchInstr()->IsMultiBranch())",
                             "Not supported for Multibranch");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pBVar7 = IR::Instr::AsBranchInstr(instr);
        pLStack_38 = IR::BranchInstr::GetTarget(pBVar7);
      }
    }
    lifetime._4_4_ = 0;
LAB_00762ee8:
    bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Empty
                      (&this->opHelperSpilledLiveranges->
                        super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      lifetime_00 = SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Pop
                              (this->opHelperSpilledLiveranges);
      *(ushort *)&lifetime_00->field_0x9c = *(ushort *)&lifetime_00->field_0x9c & 0xffef;
      if ((*(ushort *)&lifetime_00->field_0x9c >> 6 & 1) == 0) {
        AssignActiveReg(this,lifetime_00,lifetime_00->reg);
        spilledLifetime._15_1_ = 1;
        if ((pLStack_38 != (LabelInstr *)0x0) &&
           (uVar1 = lifetime_00->end, uVar5 = IR::Instr::GetNumber(&pLStack_38->super_Instr),
           uVar1 < uVar5)) {
          if ((*(ushort *)&lifetime_00->field_0x9c >> 5 & 1) == 0) {
            pBVar7 = IR::Instr::AsBranchInstr(instr);
            bVar3 = IR::BranchInstr::IsLoopTail(pBVar7,this->func);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0x265,"(!instr->AsBranchInstr()->IsLoopTail(this->func))",
                                 "!instr->AsBranchInstr()->IsLoopTail(this->func)");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            goto LAB_00762ee8;
          }
          spilledLifetime._15_1_ = 0;
        }
        spilledLifetime.lifetime._1_1_ = (*(ushort *)&lifetime_00->field_0x9c >> 5 & 1) != 0;
        spilledLifetime.lifetime._2_1_ = spilledLifetime._15_1_ & 1;
        lifetime._4_4_ = lifetime._4_4_ + 1;
        spilledLifetime.lifetime._0_1_ = lifetime_00->reg;
        dummyLabel = (PragmaInstr *)lifetime_00;
        SList<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (&this->currentOpHelperBlock->spilledLifetime,
                   (OpHelperSpilledLifetime *)&dummyLabel);
      }
      else {
        *(ushort *)&lifetime_00->field_0x9c = *(ushort *)&lifetime_00->field_0x9c & 0xffbf;
      }
      *(ushort *)&lifetime_00->field_0x9c = *(ushort *)&lifetime_00->field_0x9c & 0xffdf;
      goto LAB_00762ee8;
    }
    uVar6 = OpHelperBlock::Length(this->currentOpHelperBlock);
    this->totalOpHelperFullVisitedLength = uVar6 + this->totalOpHelperFullVisitedLength;
    instr_00 = IR::PragmaInstr::New(Nop,0,this->func);
    IR::Instr::InsertBefore(this->currentOpHelperBlock->opHelperEndInstr,&instr_00->super_Instr);
    IR::Instr::CopyNumber(&instr_00->super_Instr,this->currentOpHelperBlock->opHelperEndInstr);
    this->currentOpHelperBlock->opHelperEndInstr = &instr_00->super_Instr;
    BVUnitT<unsigned_long>::ClearAll(&this->opHelperSpilledRegs);
    this->currentOpHelperBlock = (OpHelperBlock *)0x0;
    LinearScanMD::EndOfHelperBlock(&this->linearScanMD,lifetime._4_4_);
  }
  bVar3 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::IsValid
                    (&this->opHelperBlockIter);
  if (bVar3) {
    IVar4 = IR::Instr::GetKind(instr);
    local_75 = true;
    if (IVar4 != InstrKindLabel) {
      local_75 = IR::Instr::IsProfiledLabelInstr(instr);
    }
    if (((local_75 != false) &&
        (pLVar8 = IR::Instr::AsLabelInstr(instr), ((byte)pLVar8->field_0x78 >> 1 & 1) != 0)) &&
       (pTVar9 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           (&this->opHelperBlockIter), pTVar9->opHelperLabel != (LabelInstr *)instr)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x29a,
                         "(!instr->IsLabelInstr() || !instr->AsLabelInstr()->isOpHelper || this->opHelperBlockIter.Data().opHelperLabel == instr)"
                         ,
                         "Found a helper label that doesn\'t begin the next helper block in the list?"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pTVar9 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       (&this->opHelperBlockIter);
    if (pTVar9->opHelperLabel == (LabelInstr *)instr) {
      pTVar9 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         (&this->opHelperBlockIter);
      this->currentOpHelperBlock = pTVar9;
      if ((this->opHelperBlockIter).current == (NodeBase *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      this_00 = (this->opHelperBlockIter).list;
      pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next((this->opHelperBlockIter).current);
      bVar3 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::IsHead(this_00,pSVar11);
      if (bVar3) {
        (this->opHelperBlockIter).current = (NodeBase *)0x0;
      }
      else {
        pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next((this->opHelperBlockIter).current);
        (this->opHelperBlockIter).current = pSVar11;
      }
    }
  }
  return;
}

Assistant:

void
LinearScan::CheckOpHelper(IR::Instr *instr)
{
    if (this->IsInHelperBlock())
    {
        if (this->currentOpHelperBlock->opHelperEndInstr == instr)
        {
            // Get targetInstr if we can.
            // We can deterministically get it only for unconditional branches, as conditional branch may fall through.
            IR::Instr * targetInstr = nullptr;
            if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
            {
                AssertMsg(!instr->AsBranchInstr()->IsMultiBranch(), "Not supported for Multibranch");
                targetInstr = instr->AsBranchInstr()->GetTarget();
            }

            /*
             * Keep track of the number of registers we've had to
             * store and restore around a helper block for LinearScanMD (on ARM
             * and X64). We need this to be able to allocate space in the frame.
             * We can't emit a PUSH/POP sequence around the block like IA32 because
             * the stack pointer can't move outside the prolog.
             */
            uint32 helperSpilledLiverangeCount = 0;

            // Exiting a helper block.  We are going to insert
            // the restore here after linear scan.  So put all the restored
            // lifetime back to active
            while (!this->opHelperSpilledLiveranges->Empty())
            {
                Lifetime * lifetime = this->opHelperSpilledLiveranges->Pop();
                lifetime->isOpHelperSpilled = false;

                if (!lifetime->cantOpHelperSpill)
                {
                    // Put the life time back to active
                    this->AssignActiveReg(lifetime, lifetime->reg);
                    bool reload = true;
                    // Lifetime ends before the target after helper block, don't need to save and restore helper spilled lifetime.
                    if (targetInstr && lifetime->end < targetInstr->GetNumber())
                    {
                        // However, if lifetime is spilled as arg - we still need to spill it because the helper assumes the value
                        // to be available in the stack
                        if (lifetime->isOpHelperSpillAsArg)
                        {
                            // we should not attempt to restore it as it is dead on return from the helper.
                            reload = false;
                        }
                        else
                        {
                            Assert(!instr->AsBranchInstr()->IsLoopTail(this->func));
                            continue;
                        }
                    }

                    // Save all the lifetime that needs to be restored
                    OpHelperSpilledLifetime spilledLifetime;
                    spilledLifetime.lifetime = lifetime;
                    spilledLifetime.spillAsArg = lifetime->isOpHelperSpillAsArg;
                    spilledLifetime.reload = reload;
                    /*
                     * Can't unfortunately move this into the else block above because we don't know if this
                     * lifetime will actually get spilled until register allocation completes.
                     * Instead we allocate a slot to this StackSym in LinearScanMD iff
                     * !(lifetime.isSpilled && lifetime.noReloadsIfSpilled).
                     */
                    helperSpilledLiverangeCount++;

                    // save the reg in case it is spilled later.  We still need to save and restore
                    // for the non-loop case.
                    spilledLifetime.reg = lifetime->reg;
                    this->currentOpHelperBlock->spilledLifetime.Prepend(spilledLifetime);
                }
                else
                {
                    // Clear it for the next helper block
                    lifetime->cantOpHelperSpill = false;
                }
                lifetime->isOpHelperSpillAsArg = false;
            }

            this->totalOpHelperFullVisitedLength += this->currentOpHelperBlock->Length();

            // Use a dummy label as the insertion point of the reloads, as second-chance-allocation
            // may insert compensation code right before the branch
            IR::PragmaInstr *dummyLabel = IR::PragmaInstr::New(Js::OpCode::Nop, 0, this->func);
            this->currentOpHelperBlock->opHelperEndInstr->InsertBefore(dummyLabel);
            dummyLabel->CopyNumber(this->currentOpHelperBlock->opHelperEndInstr);
            this->currentOpHelperBlock->opHelperEndInstr = dummyLabel;

            this->opHelperSpilledRegs.ClearAll();
            this->currentOpHelperBlock = nullptr;

            linearScanMD.EndOfHelperBlock(helperSpilledLiverangeCount);
        }
    }

    if (this->opHelperBlockIter.IsValid())
    {
        AssertMsg(
            !instr->IsLabelInstr() ||
            !instr->AsLabelInstr()->isOpHelper ||
            this->opHelperBlockIter.Data().opHelperLabel == instr,
            "Found a helper label that doesn't begin the next helper block in the list?");

        if (this->opHelperBlockIter.Data().opHelperLabel == instr)
        {
            this->currentOpHelperBlock = &this->opHelperBlockIter.Data();
            this->opHelperBlockIter.Next();
        }
    }
}